

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMAController.cpp
# Opt level: O1

void __thiscall Atari::ST::DMAController::DMAController(DMAController *this)

{
  Observer *pOVar1;
  WD1772 *this_00;
  uint uVar2;
  long lVar3;
  
  (this->super_Source).observer_ = (Observer *)0x0;
  pOVar1 = &this->super_Observer;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR_wd1770_did_change_output_0059e378;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0059e3a0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_0059e3b8;
  (this->running_time_).super_WrappedInt<HalfCycles>.length_ = 0;
  this_00 = &this->fdc_;
  WD1772::WD1772(this_00);
  this->control_ = 0;
  this->delegate_ = (Delegate *)0x0;
  this->interrupt_line_ = false;
  this->bus_request_line_ = false;
  lVar3 = 0x51a;
  do {
    *(undefined1 *)
     ((long)((this->fdc_).super_WD1770.super_MFMController.super_Controller.pll_.offset_history_.
             _M_elems + -7) + lVar3) = 0;
    lVar3 = lVar3 + 0x11;
  } while (lVar3 != 0x53c);
  this->address_ = 0;
  this->byte_count_ = 0;
  this->active_buffer_ = 0;
  this->bytes_received_ = 0;
  this->error_ = false;
  (this->fdc_).super_WD1770.delegate_ = &this->super_Delegate;
  (this->fdc_).super_WD1770.super_MFMController.super_Controller.super_Source.observer_ = pOVar1;
  uVar2 = (**(this->fdc_).super_WD1770.super_MFMController.super_Controller.super_Source.
             _vptr_Source)(this_00);
  (**pOVar1->_vptr_Observer)(pOVar1,this_00,(ulong)uVar2);
  return;
}

Assistant:

DMAController::DMAController() {
	fdc_.set_delegate(this);
	fdc_.set_clocking_hint_observer(this);
}